

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

void __thiscall
icu_63::DayPeriodRulesDataSink::put
          (DayPeriodRulesDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  undefined1 auVar1 [16];
  UErrorCode UVar2;
  char *__s1;
  UBool UVar3;
  int iVar4;
  int iVar5;
  int32_t value_00;
  UMemory *this_00;
  undefined2 *puVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  undefined2 *puVar7;
  ulong uVar8;
  char *size;
  int i;
  int32_t len;
  ResourceTable dayPeriodData;
  ResourceTable locales;
  ResourceTable rules;
  char *local_f8;
  int32_t local_ec;
  ConstChar16Ptr local_e8;
  UErrorCode local_dc;
  DayPeriodRulesDataSink *local_d8;
  char16_t *local_d0;
  ResourceTable local_c0;
  ResourceTable local_98;
  UnicodeString local_70;
  
  local_f8 = key;
  local_d8 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_c0,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    UVar3 = ResourceTable::getKeyAndValue(&local_c0,0,&local_f8,value);
    if (UVar3 != '\0') {
      do {
        __s1 = local_f8;
        iVar4 = strcmp(local_f8,"locales");
        if (iVar4 == 0) {
          (*(value->super_UObject)._vptr_UObject[0xb])(&local_98,value,errorCode);
          local_dc = *errorCode;
          if (U_ZERO_ERROR < local_dc) {
            return;
          }
          UVar3 = ResourceTable::getKeyAndValue(&local_98,0,&local_f8,value);
          UVar2 = local_dc;
          if (UVar3 != '\0') {
            iVar4 = 1;
            do {
              local_ec = 0;
              iVar5 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_ec,errorCode);
              local_e8.p_ = (char16_t *)CONCAT44(extraout_var,iVar5);
              icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_e8,local_ec);
              local_d0 = local_e8.p_;
              value_00 = parseSetNum(&local_70,errorCode);
              uhash_puti_63((UHashtable *)*(anonymous_namespace)::data,local_f8,value_00,errorCode);
              icu_63::UnicodeString::~UnicodeString(&local_70);
              UVar3 = ResourceTable::getKeyAndValue(&local_98,iVar4,&local_f8,value);
              iVar4 = iVar4 + 1;
              UVar2 = local_dc;
            } while (UVar3 != '\0');
          }
joined_r0x002cfba0:
          if (U_ZERO_ERROR < UVar2) {
            return;
          }
        }
        else {
          size = "rules";
          iVar4 = strcmp(__s1,"rules");
          if (iVar4 == 0) {
            uVar8 = (long)*(int *)((anonymous_namespace)::data + 2) + 1;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar8;
            this_00 = SUB168(auVar1 * ZEXT816(100),0);
            if (SUB168(auVar1 * ZEXT816(100),8) != 0) {
              this_00 = (UMemory *)0xffffffffffffffff;
            }
            puVar6 = (undefined2 *)UMemory::operator_new__(this_00,(size_t)size);
            if (puVar6 == (undefined2 *)0x0) {
              puVar6 = (undefined2 *)0x0;
            }
            else if ((int)uVar8 != 0) {
              puVar7 = puVar6;
              do {
                *puVar7 = 0;
                *(undefined4 *)(puVar7 + 2) = 0xffffffff;
                *(undefined4 *)(puVar7 + 4) = 0xffffffff;
                *(undefined4 *)(puVar7 + 6) = 0xffffffff;
                *(undefined4 *)(puVar7 + 8) = 0xffffffff;
                *(undefined4 *)(puVar7 + 10) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0xc) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0xe) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x10) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x12) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x14) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x16) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x18) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x1a) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x1c) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x1e) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x20) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x22) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x24) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x26) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x28) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x2a) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x2c) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x2e) = 0xffffffff;
                *(undefined4 *)(puVar7 + 0x30) = 0xffffffff;
                puVar7 = puVar7 + 0x32;
              } while (puVar7 != puVar6 + uVar8 * 0x32);
            }
            (anonymous_namespace)::data[1] = puVar6;
            if (puVar6 == (undefined2 *)0x0) {
              *errorCode = U_MEMORY_ALLOCATION_ERROR;
              return;
            }
            (*(value->super_UObject)._vptr_UObject[0xb])(&local_70,value,errorCode);
            processRules(local_d8,(ResourceTable *)&local_70,local_f8,value,errorCode);
            UVar2 = *errorCode;
            goto joined_r0x002cfba0;
          }
        }
        i = i + 1;
        UVar3 = ResourceTable::getKeyAndValue(&local_c0,i,&local_f8,value);
      } while (UVar3 != '\0');
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable dayPeriodData = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; dayPeriodData.getKeyAndValue(i, key, value); ++i) {
            if (uprv_strcmp(key, "locales") == 0) {
                ResourceTable locales = value.getTable(errorCode);
                if (U_FAILURE(errorCode)) { return; }

                for (int32_t j = 0; locales.getKeyAndValue(j, key, value); ++j) {
                    UnicodeString setNum_str = value.getUnicodeString(errorCode);
                    int32_t setNum = parseSetNum(setNum_str, errorCode);
                    uhash_puti(data->localeToRuleSetNumMap, const_cast<char *>(key), setNum, &errorCode);
                }
            } else if (uprv_strcmp(key, "rules") == 0) {
                // Allocate one more than needed to skip [0]. See comment in parseSetNum().
                data->rules = new DayPeriodRules[data->maxRuleSetNum + 1];
                if (data->rules == NULL) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                ResourceTable rules = value.getTable(errorCode);
                processRules(rules, key, value, errorCode);
                if (U_FAILURE(errorCode)) { return; }
            }
        }
    }